

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBCopyAlphaRow_C(uint8_t *src,uint8_t *dst,int width)

{
  int i;
  int width_local;
  uint8_t *dst_local;
  uint8_t *src_local;
  
  dst_local = dst;
  src_local = src;
  for (i = 0; i < width + -1; i = i + 2) {
    dst_local[3] = src_local[3];
    dst_local[7] = src_local[7];
    dst_local = dst_local + 8;
    src_local = src_local + 8;
  }
  if ((width & 1U) != 0) {
    dst_local[3] = src_local[3];
  }
  return;
}

Assistant:

void ARGBCopyAlphaRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int i;
  for (i = 0; i < width - 1; i += 2) {
    dst[3] = src[3];
    dst[7] = src[7];
    dst += 8;
    src += 8;
  }
  if (width & 1) {
    dst[3] = src[3];
  }
}